

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

void ScanDirectoryFilesRecursively(char *basePath,FilePathList *files,char *filter)

{
  _Bool _Var1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  uint uVar4;
  char acStack_1038 [4104];
  
  memset(acStack_1038,0,0x1000);
  __dirp = opendir(basePath);
  if (__dirp == (DIR *)0x0) {
    TraceLog(4,"FILEIO: Directory cannot be opened (%s)",basePath);
    return;
  }
  do {
    while( true ) {
      do {
        pdVar3 = readdir(__dirp);
        if ((pdVar3 == (dirent *)0x0) || (files->capacity <= files->count)) goto LAB_00122ff2;
      } while ((pdVar3->d_name[0] == '.') &&
              ((pdVar3->d_name[1] == '\0' ||
               ((pdVar3->d_name[1] == '.' && (pdVar3->d_name[2] == '\0'))))));
      sprintf(acStack_1038,"%s/%s",basePath,pdVar3->d_name);
      _Var1 = IsPathFile(acStack_1038);
      if (_Var1) break;
      if (filter == (char *)0x0) {
        uVar4 = files->count;
      }
      else {
        iVar2 = TextFindIndex(filter,"DIR");
        uVar4 = files->count;
        if (-1 < iVar2) {
          strcpy(files->paths[uVar4],acStack_1038);
          uVar4 = files->count + 1;
          files->count = uVar4;
        }
      }
      if (files->capacity <= uVar4) goto LAB_00122fe1;
      ScanDirectoryFilesRecursively(acStack_1038,files,filter);
    }
    if (filter == (char *)0x0) {
      uVar4 = files->count;
LAB_00122f6f:
      strcpy(files->paths[uVar4],acStack_1038);
      uVar4 = files->count + 1;
      files->count = uVar4;
    }
    else {
      _Var1 = IsFileExtension(acStack_1038,filter);
      uVar4 = files->count;
      if (_Var1) goto LAB_00122f6f;
    }
  } while (uVar4 < files->capacity);
LAB_00122fe1:
  TraceLog(4,"FILEIO: Maximum filepath scan capacity reached (%i files)");
LAB_00122ff2:
  closedir(__dirp);
  return;
}

Assistant:

static void ScanDirectoryFilesRecursively(const char *basePath, FilePathList *files, const char *filter)
{
    char path[MAX_FILEPATH_LENGTH] = { 0 };
    memset(path, 0, MAX_FILEPATH_LENGTH);

    struct dirent *dp = NULL;
    DIR *dir = opendir(basePath);

    if (dir != NULL)
    {
        while (((dp = readdir(dir)) != NULL) && (files->count < files->capacity))
        {
            if ((strcmp(dp->d_name, ".") != 0) && (strcmp(dp->d_name, "..") != 0))
            {
                // Construct new path from our base path
            #if defined(_WIN32)
                sprintf(path, "%s\\%s", basePath, dp->d_name);
            #else
                sprintf(path, "%s/%s", basePath, dp->d_name);
            #endif

                if (IsPathFile(path))
                {
                    if (filter != NULL)
                    {
                        if (IsFileExtension(path, filter))
                        {
                            strcpy(files->paths[files->count], path);
                            files->count++;
                        }
                    }
                    else
                    {
                        strcpy(files->paths[files->count], path);
                        files->count++;
                    }

                    if (files->count >= files->capacity)
                    {
                        TRACELOG(LOG_WARNING, "FILEIO: Maximum filepath scan capacity reached (%i files)", files->capacity);
                        break;
                    }
                }
                else
                {
                    if ((filter != NULL) && (TextFindIndex(filter, DIRECTORY_FILTER_TAG) >= 0))
                    {
                        strcpy(files->paths[files->count], path);
                        files->count++;
                    }

                    if (files->count >= files->capacity)
                    {
                        TRACELOG(LOG_WARNING, "FILEIO: Maximum filepath scan capacity reached (%i files)", files->capacity);
                        break;
                    }

                    ScanDirectoryFilesRecursively(path, files, filter);
                }
            }
        }

        closedir(dir);
    }
    else TRACELOG(LOG_WARNING, "FILEIO: Directory cannot be opened (%s)", basePath);
}